

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

wchar_t cmp_level(void *a,void *b)

{
  uint16_t ib;
  uint16_t ia;
  void *b_local;
  void *a_local;
  
  if (r_info[*a].level < r_info[*b].level) {
    a_local._4_4_ = L'\xffffffff';
  }
  else if (r_info[*b].level < r_info[*a].level) {
    a_local._4_4_ = L'\x01';
  }
  else {
    a_local._4_4_ = cmp_mexp(a,b);
  }
  return a_local._4_4_;
}

Assistant:

static int cmp_level(const void *a, const void *b)
{
	uint16_t ia = *(const uint16_t *)a;
	uint16_t ib = *(const uint16_t *)b;
	if (r_info[ia].level < r_info[ib].level)
		return -1;
	if (r_info[ia].level > r_info[ib].level)
		return 1;
	return cmp_mexp(a, b);
}